

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult *
iutest::internal::EqFailure
          (AssertionResult *__return_storage_ptr__,char *expected_expression,char *actual_expression
          ,string *expected,string *actual,bool ignoring_case)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  AssertionResult *pAVar6;
  iu_global_format_stringstream strm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  AssertionResult local_1e0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"error: Value of ",0x10);
  if (actual_expression == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen(actual_expression);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,actual_expression,sVar4)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  Actual: ",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(actual->_M_dataplus)._M_p,actual->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nExpected: ",0xb);
  if (expected_expression == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(expected_expression);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,expected_expression,sVar4);
  }
  if (ignoring_case) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (ignoring case)",0x10)
    ;
  }
  iVar3 = strcmp(expected_expression,(expected->_M_dataplus)._M_p);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nWhich is: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(expected->_M_dataplus)._M_p,expected->_M_string_length);
  }
  paVar1 = &local_1e0.m_message.field_2;
  local_1e0.m_message._M_string_length = 0;
  local_1e0.m_message.field_2._M_local_buf[0] = '\0';
  local_1e0.m_result = false;
  local_1e0.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str();
  pAVar6 = AssertionResult::operator<<(&local_1e0,&local_200);
  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_message).field_2;
  pcVar2 = (pAVar6->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar6->m_message)._M_string_length);
  __return_storage_ptr__->m_result = pAVar6->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1e0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1e0.m_message.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult EqFailure(const char* expected_expression, const char* actual_expression
    , const ::std::string& expected, const ::std::string& actual, bool ignoring_case = false)
{
    iu_global_format_stringstream strm;
    strm << "error: Value of " << actual_expression
        << "\n  Actual: " << actual
        << "\nExpected: " << expected_expression;
    if( ignoring_case )
    {
        strm << " (ignoring case)";
    }
    if( !detail::IsStringEqual(expected_expression, expected.c_str()) )
    {
        strm << "\nWhich is: " << expected;
    }
    return AssertionFailure() << strm.str();
}